

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O1

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::Walk
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNode *pnode,Context context)

{
  OpCode OVar1;
  bool bVar2;
  ResultType RVar3;
  int iVar4;
  uint uVar5;
  ParseNodeExportDefault *pPVar6;
  ParseNodeVar *pPVar7;
  ParseNodeForInOrForOf *pnode_00;
  ParseNodeUni *pPVar8;
  ParseNodeCall *pPVar9;
  ParseNodeSwitch *pnode_01;
  ParseNodeProg *pnode_02;
  ParseNodeTri *pnode_03;
  ParseNodeClass *pnode_04;
  ParseNodeTryCatch *pnode_05;
  ParseNodeWhile *pPVar10;
  ParseNodeFor *pnode_06;
  ParseNodeBlock *pnode_07;
  ParseNodeWith *pnode_08;
  ParseNodeIf *pnode_09;
  ParseNodeFnc *pnode_10;
  ParseNodeCase *pnode_11;
  ParseNodeStrTemplate *pnode_12;
  ParseNodeReturn *pPVar11;
  ParseNodeTry *pPVar12;
  ParseNodeTryFinally *pnode_13;
  ParseNodeCatch *pnode_14;
  ParseNodeBin *pnode_15;
  Context in_RCX;
  ParseNodePtr pPVar13;
  ParseNode *local_38;
  
LAB_008326f7:
  if (pnode != (ParseNode *)0x0) {
    OVar1 = pnode->nop;
    local_38 = pnode;
    switch(OVar1) {
    case knopCall:
    case knopNew:
      pPVar9 = ParseNode::AsParseNodeCall(pnode);
      iVar4 = (**(this->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(this,pPVar9->pnodeTarget,context);
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar2) {
        return (ResultType)(char)iVar4;
      }
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar2) {
        return true;
      }
      RVar3 = WalkList(this,(ParseNode *)&pPVar9->pnodeArgs,(ParseNode **)context,in_RCX);
      return RVar3;
    case knopQmark:
      pnode_03 = ParseNode::AsParseNodeTri(pnode);
      RVar3 = WalkTernary(this,pnode_03,context);
      return RVar3;
    case knopList:
      RVar3 = WalkList(this,(ParseNode *)&local_38,(ParseNode **)context,in_RCX);
      return RVar3;
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
    case knopTemp:
      pPVar7 = ParseNode::AsParseNodeVar(pnode);
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar2) {
        return true;
      }
      pPVar13 = pPVar7->pnodeInit;
      break;
    case knopFncDecl:
      pnode_10 = ParseNode::AsParseNodeFnc(pnode);
      RVar3 = WalkFnc(this,pnode_10,context);
      return RVar3;
    case knopClassDecl:
      pnode_04 = ParseNode::AsParseNodeClass(pnode);
      RVar3 = WalkClass(this,pnode_04,context);
      return RVar3;
    case knopProg:
      pnode_02 = ParseNode::AsParseNodeProg(pnode);
      RVar3 = WalkProg(this,pnode_02,context);
      return RVar3;
    case knopFor:
      pnode_06 = ParseNode::AsParseNodeFor(pnode);
      RVar3 = WalkFor(this,pnode_06,context);
      return RVar3;
    case knopIf:
      pnode_09 = ParseNode::AsParseNodeIf(pnode);
      RVar3 = WalkIf(this,pnode_09,context);
      return RVar3;
    case knopWhile:
      pPVar10 = ParseNode::AsParseNodeWhile(pnode);
      RVar3 = WalkWhile(this,pPVar10,context);
      return RVar3;
    case knopDoWhile:
      pPVar10 = ParseNode::AsParseNodeWhile(pnode);
      RVar3 = WalkDoWhile(this,pPVar10,context);
      return RVar3;
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
      pnode_00 = ParseNode::AsParseNodeForInOrForOf(pnode);
      RVar3 = WalkForInOrForOf(this,pnode_00,context);
      return RVar3;
    case knopBlock:
      pnode_07 = ParseNode::AsParseNodeBlock(pnode);
      RVar3 = WalkBlock(this,pnode_07,context);
      return RVar3;
    case knopStrTemplate:
      pnode_12 = ParseNode::AsParseNodeStrTemplate(pnode);
      RVar3 = WalkStringTemplate(this,pnode_12,context);
      return RVar3;
    case knopWith:
      pnode_08 = ParseNode::AsParseNodeWith(pnode);
      RVar3 = WalkWith(this,pnode_08,context);
      return RVar3;
    case knopSwitch:
      goto switchD_00832719_caseD_67;
    case knopCase:
      pnode_11 = ParseNode::AsParseNodeCase(pnode);
      RVar3 = WalkCase(this,pnode_11,context);
      return RVar3;
    case knopTryCatch:
      pnode_05 = ParseNode::AsParseNodeTryCatch(pnode);
      RVar3 = WalkTryCatch(this,pnode_05,context);
      return RVar3;
    case knopCatch:
      pnode_14 = ParseNode::AsParseNodeCatch(pnode);
      RVar3 = WalkCatch(this,pnode_14,context);
      return RVar3;
    case knopReturn:
      pPVar11 = ParseNode::AsParseNodeReturn(pnode);
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar2) {
        return true;
      }
      pPVar13 = pPVar11->pnodeExpr;
      break;
    case knopTry:
      pPVar12 = ParseNode::AsParseNodeTry(pnode);
      goto LAB_00832a84;
    case knopThrow:
switchD_00832719_caseD_6d:
      pPVar8 = ParseNode::AsParseNodeUni(pnode);
      iVar4 = (**(this->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(this,pPVar8->pnode1,context);
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      return (ResultType)(bVar2 | (byte)iVar4);
    case knopFinally:
      pPVar12 = (ParseNodeTry *)ParseNode::AsParseNodeFinally(pnode);
LAB_00832a84:
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar2) {
        return true;
      }
      pPVar13 = pPVar12->pnodeBody;
      goto LAB_00832a9a;
    case knopTryFinally:
      pnode_13 = ParseNode::AsParseNodeTryFinally(pnode);
      RVar3 = WalkTryFinally(this,pnode_13,context);
      return RVar3;
    case knopExportDefault:
      goto switchD_00832719_caseD_74;
    default:
      if (OVar1 - 0x12 < 2) goto switchD_00832719_caseD_6d;
    case knopDot:
    case knopAsg:
    case knopInstOf:
    case knopIn:
    case knopEqv:
    case knopNEqv:
    case knopComma:
    case knopLogOr:
    case knopLogAnd:
    case knopCoalesce:
    case knopLsh:
    case knopRsh:
    case knopRs2:
    case knopIndex:
    case knopAsgAdd:
    case knopAsgSub:
    case knopAsgMul:
    case knopAsgDiv:
    case knopAsgExpo:
    case knopAsgMod:
    case knopAsgAnd:
    case knopAsgXor:
    case knopAsgOr:
    case knopAsgLsh:
    case knopAsgRsh:
    case knopAsgRs2:
    case knopMember:
    case knopMemberShort:
    case knopSetMember:
    case knopGetMember:
    case knopModule:
    case knopEndCode:
    case knopDebugger:
    case knopBreak:
    case knopContinue:
    case knopObjectPattern:
    case knopObjectPatternMember:
    case knopArrayPattern:
    case knopParamPattern:
      uVar5 = ParseNode::Grfnop((uint)OVar1);
      if ((uVar5 & 2) != 0) {
        return true;
      }
      if ((uVar5 & 8) != 0) {
        pnode_15 = ParseNode::AsParseNodeBin(pnode);
        RVar3 = WalkBinary(this,pnode_15,context);
        return RVar3;
      }
      if ((uVar5 & 4) == 0) {
        if ((uVar5 >> 10 & 1) != 0) {
          return true;
        }
        ParseNodeWalker<ByteCodeGenerator::Generate(ParseNodeProg*,unsigned_int,ByteCodeGenerator*,Js::ParseableFunctionInfo**,unsigned_int,bool,Parser*,Js::ScriptFunction**)::WalkerPolicyTest>
        ::Walk();
switchD_00832719_caseD_67:
        pnode_01 = ParseNode::AsParseNodeSwitch(pnode);
        RVar3 = WalkSwitch(this,pnode_01,context);
        return RVar3;
      }
      pPVar8 = ParseNode::AsParseNodeUni(pnode);
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar2) {
        return true;
      }
      pPVar13 = pPVar8->pnode1;
    }
    if (pPVar13 != (ParseNodePtr)0x0) {
LAB_00832a9a:
      iVar4 = (**(this->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(this,pPVar13,context);
      return SUB41(iVar4,0);
    }
  }
  return true;
switchD_00832719_caseD_74:
  pPVar6 = ParseNode::AsParseNodeExportDefault(pnode);
  pnode = pPVar6->pnodeExpr;
  goto LAB_008326f7;
}

Assistant:

ResultType Walk(ParseNode *pnode, Context context)
    {
        if (!pnode) return DefaultResult();

        switch (pnode->nop) {
        // Handle all special cases first.

        // Post-fix unary operators.
        //PTNODE(knopIncPost    , "++ post"    ,Inc     ,Uni  ,fnopUni|fnopAsg)
        //PTNODE(knopDecPost    , "-- post"    ,Dec     ,Uni  ,fnopUni|fnopAsg)
        case knopIncPost:
        case knopDecPost:
            return WalkPostUnary(pnode->AsParseNodeUni(), context);

        // Call and call like
        //PTNODE(knopCall       , "()"        ,None    ,Bin  ,fnopBin)
        //PTNODE(knopNew        , "new"        ,None    ,Bin  ,fnopBin)
        case knopCall:
        case knopNew:
            return WalkCall(pnode->AsParseNodeCall(), context);

        // Ternary operator
        //PTNODE(knopQmark      , "?"            ,None    ,Tri  ,fnopBin)
        case knopQmark:
            return WalkTernary(pnode->AsParseNodeTri(), context);

        // General nodes.
        //PTNODE(knopList       , "<list>"    ,None    ,Bin  ,fnopNone)
        case knopList:
            return WalkList(NULL, pnode, context);

        //PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
        case knopVarDecl:
        case knopConstDecl:
        case knopLetDecl:
        case knopTemp:
            return WalkVar(pnode->AsParseNodeVar(), context);

        //PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
        case knopFncDecl:
            return WalkFnc(pnode->AsParseNodeFnc(), context);

        //PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
        case knopProg:
            return WalkProg(pnode->AsParseNodeProg(), context);

        //PTNODE(knopFor        , "for"        ,None    ,For  ,fnopBreak|fnopContinue)
        case knopFor:
            return WalkFor(pnode->AsParseNodeFor(), context);

        //PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
        case knopIf:
            return WalkIf(pnode->AsParseNodeIf(), context);

        //PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
        case knopWhile:
            return WalkWhile(pnode->AsParseNodeWhile(), context);

         //PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
        case knopDoWhile:
            return WalkDoWhile(pnode->AsParseNodeWhile(), context);

        //PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
        case knopForIn:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        case knopForOf:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        case knopForAwaitOf:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        //PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
        case knopReturn:
            return WalkReturn(pnode->AsParseNodeReturn(), context);

        //PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
        case knopBlock:
            return WalkBlock(pnode->AsParseNodeBlock(), context);

        //PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
        case knopWith:
            return WalkWith(pnode->AsParseNodeWith(), context);

        //PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
        case knopSwitch:
            return WalkSwitch(pnode->AsParseNodeSwitch(), context);

        //PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
        case knopCase:
            return WalkCase(pnode->AsParseNodeCase(), context);

        //PTNODE(knopTryFinally,"try-finally",None,TryFinally,fnopCleanup)
        case knopTryFinally:
            return WalkTryFinally(pnode->AsParseNodeTryFinally(), context);

       case knopFinally:
           return WalkFinally(pnode->AsParseNodeFinally(), context);

        //PTNODE(knopCatch      , "catch"     ,None    ,Catch,fnopNone)
        case knopCatch:
            return WalkCatch(pnode->AsParseNodeCatch(), context);

        //PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
        case knopTryCatch:
            return WalkTryCatch(pnode->AsParseNodeTryCatch(), context);

        //PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
        case knopTry:
            return WalkTry(pnode->AsParseNodeTry(), context);

        //PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
        case knopThrow:
            return WalkPostUnary(pnode->AsParseNodeUni(), context);

        case knopStrTemplate:
            return WalkStringTemplate(pnode->AsParseNodeStrTemplate(), context);

        //PTNODE(knopClassDecl  , "classDecl" ,None    ,Class       ,fnopLeaf)
        case knopClassDecl:
            return WalkClass(pnode->AsParseNodeClass(), context);

        case knopExportDefault:
            return Walk(pnode->AsParseNodeExportDefault()->pnodeExpr, context);

        default:
        {
            uint fnop = ParseNode::Grfnop(pnode->nop);

            if (fnop & fnopLeaf || fnop & fnopNone)
            {
                return WalkLeaf(pnode, context);
            }
            else if (fnop & fnopBin)
            {
                return WalkBinary(pnode->AsParseNodeBin(), context);
            }
            else if (fnop & fnopUni)
            {
                // Prefix unary operators.
                return WalkPreUnary(pnode->AsParseNodeUni(), context);
            }

            // Some node types are both fnopNotExprStmt and something else. Try the above cases first and fall back to this one.
            if (fnop & fnopNotExprStmt)
            {
                return WalkLeaf(pnode, context);
            }

            Assert(false);
            __assume(false);
        }
        }
    }